

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Minimum(MinimumForm4 Minimum)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar6;
  uint uVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  byte *pbVar12;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  anon_class_8_1_a814987b in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe84;
  uint8_t value;
  size_type __n;
  size_type __n_00;
  Image *image_00;
  uint32_t *in_stack_fffffffffffffed0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  uint32_t *in_stack_fffffffffffffed8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffee0;
  size_type __n_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffee8;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffef0;
  undefined4 local_c0;
  undefined4 local_bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_88;
  undefined1 *local_70;
  uchar *local_68;
  uchar *local_60;
  undefined1 local_58 [48];
  code *local_28;
  
  local_28 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_fffffffffffffe68.image >> 0x20));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)0x1dd274);
  local_60 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffe68.image);
  local_68 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffe68.image);
  __first._M_current._4_4_ = in_stack_fffffffffffffe7c;
  __first._M_current._0_4_ = in_stack_fffffffffffffe78;
  __last._M_current._4_4_ = in_stack_fffffffffffffe74;
  __last._M_current._0_4_ = in_stack_fffffffffffffe70;
  local_70 = local_58;
  local_88 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)std::
                for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Function_Template::form4_Minimum(void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int))::__0>
                          (__first,__last,in_stack_fffffffffffffe68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dd2fd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dd312);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  __n = 0;
  image_00 = (Image *)local_58;
  pvVar8 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)image_00,0);
  this = &local_a0;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,__n);
  vVar1 = *pvVar9;
  this_00 = &local_b8;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,__n);
  vVar2 = *pvVar9;
  __n_00 = 1;
  pvVar10 = std::
            vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                          *)image_00,1);
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,__n_00);
  vVar3 = *pvVar9;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,__n_00);
  vVar4 = *pvVar9;
  __n_01 = 2;
  pvVar11 = std::
            vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                          *)image_00,2);
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,__n_01);
  vVar5 = *pvVar9;
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,__n_01);
  (*local_28)(pvVar8,vVar1,vVar2,pvVar10,vVar3,vVar4,pvVar11,vVar5,*pvVar9,local_bc,local_c0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                *)local_58,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_a0,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_b8,2);
  pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_58 + 0x18),0)
  ;
  uVar7 = (uint)*pbVar12;
  pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_58 + 0x18),1)
  ;
  if ((int)uVar7 < (int)(uint)*pbVar12) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_58 + 0x18),0);
    value = (uint8_t)(uVar7 >> 0x18);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_58 + 0x18),1);
    value = (uint8_t)(uVar7 >> 0x18);
  }
  bVar6 = Unit_Test::verifyImage
                    (image_00,(uint32_t)(__n_00 >> 0x20),(uint32_t)__n_00,(uint32_t)(__n >> 0x20),
                     (uint32_t)__n,value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe84,local_bc));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe84,local_bc));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)CONCAT44(in_stack_fffffffffffffe84,local_bc));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe84,local_bc));
  return bVar6;
}

Assistant:

bool form4_Minimum(MinimumForm4 Minimum)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > image;

        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { image.push_back( uniformImage( value ) ); } );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        Minimum( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], image[2], roiX[2], roiY[2], roiWidth, roiHeight );

        return verifyImage( image[2], roiX[2], roiY[2], roiWidth, roiHeight,
                          intensity[0] < intensity[1] ? intensity[0] : intensity[1] );
    }